

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  char *pcVar6;
  PrimRefMB *pPVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  undefined4 uVar17;
  BufferView<embree::Vec3fa> *pBVar18;
  bool bVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  size_t sVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar45;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar46;
  float fVar47;
  undefined1 auVar49 [12];
  float fVar48;
  uint uVar61;
  float fVar62;
  Vec3fa n1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar60;
  float fVar63;
  float fVar78;
  float fVar79;
  Vec3fa n0;
  float fVar64;
  float fVar80;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar81;
  float fVar82;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar104;
  float fVar105;
  vfloat4 a;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar106;
  float fVar112;
  float fVar113;
  Vec3ff v3;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar111;
  float fVar114;
  float fVar115;
  float fVar120;
  undefined1 auVar116 [12];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar119;
  float fVar126;
  float fVar127;
  float fVar133;
  undefined1 auVar128 [12];
  float fVar134;
  float fVar135;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar132;
  float fVar136;
  float fVar145;
  float fVar149;
  vfloat4 a_1;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar142 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar143;
  undefined1 auVar144 [16];
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar156;
  uint uVar162;
  uint uVar163;
  uint uVar164;
  undefined1 auVar160 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar161;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar167;
  float fVar168;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar169 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar170;
  float fVar177;
  float fVar178;
  undefined1 auVar174 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar175;
  undefined1 auVar176 [16];
  float fVar179;
  uint uVar180;
  float fVar181;
  uint uVar182;
  float fVar183;
  uint uVar184;
  float fVar185;
  uint uVar186;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_348;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_338;
  BBox1f local_328;
  ulong local_298;
  unsigned_long local_250;
  size_t local_248;
  size_t local_240;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_238;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_228;
  ulong local_110;
  anon_class_16_2_07cfa4d6 local_108;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar12;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar13 = r->_begin;
  aVar46 = _DAT_01f7aa00;
  aVar111 = _DAT_01f7a9f0;
  aVar156 = _DAT_01f7a9f0;
  aVar161 = _DAT_01f7aa00;
  if (uVar13 < r->_end) {
    fVar48 = 0.0;
    fVar62 = 1.0;
    fVar136 = 1.0;
    local_250 = 0;
    local_248 = 0;
    local_298 = 0;
    local_238 = _DAT_01f7aa00;
    local_228 = _DAT_01f7a9f0;
    fVar95 = 0.0;
    local_240 = k;
    do {
      local_328 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                  super_Geometry.time_range;
      fVar63 = local_328.lower;
      fVar11 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               super_Geometry.fnumTimeSegments;
      fVar28 = t0t1->lower;
      fVar27 = t0t1->upper;
      fVar47 = local_328.upper - fVar63;
      fVar26 = floorf(((fVar28 - fVar63) / fVar47) * 1.0000002 * fVar11);
      fVar47 = ceilf(((fVar27 - fVar63) / fVar47) * 0.99999976 * fVar11);
      uVar21 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar13);
      uVar12 = (ulong)(uVar21 + 3);
      pBVar4 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar12 < (pBVar4->super_RawBufferView).num) {
        fVar63 = 0.0;
        if (0.0 <= fVar26) {
          fVar63 = fVar26;
        }
        if (fVar11 <= fVar47) {
          fVar47 = fVar11;
        }
        if ((uint)(int)fVar63 <= (uint)(int)fVar47) {
          uVar15 = (ulong)(int)fVar63;
          pBVar5 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   normals.items;
          fVar26 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   maxRadiusScale;
          pBVar18 = pBVar5;
          do {
            pcVar6 = pBVar4[uVar15].super_RawBufferView.ptr_ofs;
            sVar24 = pBVar4[uVar15].super_RawBufferView.stride;
            lVar14 = sVar24 * uVar21;
            lVar20 = sVar24 * (uVar21 + 1);
            lVar23 = sVar24 * (uVar21 + 2);
            lVar16 = sVar24 * uVar12;
            auVar44._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar20 + 0xc)));
            auVar44._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar14 + 0xc)));
            auVar44._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar23 + 0xc)));
            auVar44._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar16 + 0xc)));
            iVar22 = movmskps((int)pBVar18,auVar44);
            if (iVar22 != 0) goto LAB_00998c14;
            pfVar1 = (float *)(pcVar6 + lVar14);
            fVar63 = *pfVar1;
            fVar81 = pfVar1[1];
            fVar90 = pfVar1[2];
            fVar93 = pfVar1[3];
            fVar126 = (float)DAT_01f7f920;
            fVar133 = DAT_01f7f920._4_4_;
            fVar134 = DAT_01f7f920._8_4_;
            fVar135 = DAT_01f7f920._12_4_;
            auVar59._0_4_ = -(uint)(fVar126 < fVar63 && fVar63 < 1.844e+18);
            auVar59._4_4_ = -(uint)(fVar133 < fVar81 && fVar81 < 1.844e+18);
            auVar59._8_4_ = -(uint)(fVar134 < fVar90 && fVar90 < 1.844e+18);
            auVar59._12_4_ = -(uint)(fVar135 < fVar93 && fVar93 < 1.844e+18);
            uVar17 = movmskps(0,auVar59);
            if ((~(byte)uVar17 & 7) != 0) goto LAB_00998c14;
            auVar44 = *(undefined1 (*) [16])(pcVar6 + lVar20);
            fVar114 = auVar44._0_4_;
            fVar120 = auVar44._4_4_;
            fVar122 = auVar44._8_4_;
            fVar124 = auVar44._12_4_;
            auVar65._0_4_ = -(uint)(fVar126 < fVar114 && fVar114 < 1.844e+18);
            auVar65._4_4_ = -(uint)(fVar133 < fVar120 && fVar120 < 1.844e+18);
            auVar65._8_4_ = -(uint)(fVar134 < fVar122 && fVar122 < 1.844e+18);
            auVar65._12_4_ = -(uint)(fVar135 < fVar124 && fVar124 < 1.844e+18);
            uVar17 = movmskps(CONCAT31((int3)((uint)uVar17 >> 8),~(byte)uVar17),auVar65);
            if ((~(byte)uVar17 & 7) != 0) goto LAB_00998c14;
            pfVar1 = (float *)(pcVar6 + lVar23);
            fVar82 = *pfVar1;
            fVar104 = pfVar1[1];
            fVar105 = pfVar1[2];
            fVar88 = pfVar1[3];
            auVar142._0_4_ = -(uint)(fVar126 < fVar82 && fVar82 < 1.844e+18);
            auVar142._4_4_ = -(uint)(fVar133 < fVar104 && fVar104 < 1.844e+18);
            auVar142._8_4_ = -(uint)(fVar134 < fVar105 && fVar105 < 1.844e+18);
            auVar142._12_4_ = -(uint)(fVar135 < fVar88 && fVar88 < 1.844e+18);
            uVar17 = movmskps(CONCAT31((int3)((uint)uVar17 >> 8),~(byte)uVar17),auVar142);
            pBVar18 = (BufferView<embree::Vec3fa> *)
                      (ulong)CONCAT31((int3)((uint)uVar17 >> 8),~(byte)uVar17);
            if ((~(byte)uVar17 & 7) != 0) goto LAB_00998c14;
            pfVar1 = (float *)(pcVar6 + lVar16);
            fVar89 = *pfVar1;
            fVar91 = pfVar1[1];
            fVar92 = pfVar1[2];
            fVar94 = pfVar1[3];
            auVar166._0_4_ = -(uint)(fVar126 < fVar89 && fVar89 < 1.844e+18);
            auVar166._4_4_ = -(uint)(fVar133 < fVar91 && fVar91 < 1.844e+18);
            auVar166._8_4_ = -(uint)(fVar134 < fVar92 && fVar92 < 1.844e+18);
            auVar166._12_4_ = -(uint)(fVar135 < fVar94 && fVar94 < 1.844e+18);
            uVar17 = movmskps((int)lVar16,auVar166);
            if ((~(byte)uVar17 & 7) != 0) goto LAB_00998c14;
            pcVar6 = pBVar5[uVar15].super_RawBufferView.ptr_ofs;
            sVar24 = pBVar5[uVar15].super_RawBufferView.stride;
            lVar14 = sVar24 * uVar21;
            pfVar1 = (float *)(pcVar6 + lVar14);
            fVar127 = *pfVar1;
            fVar148 = pfVar1[1];
            fVar152 = pfVar1[2];
            auVar169._0_4_ = -(uint)(fVar126 < fVar127 && fVar127 < 1.844e+18);
            auVar169._4_4_ = -(uint)(fVar133 < fVar148 && fVar148 < 1.844e+18);
            auVar169._8_4_ = -(uint)(fVar134 < fVar152 && fVar152 < 1.844e+18);
            auVar169._12_4_ = -(uint)(fVar135 < pfVar1[3] && pfVar1[3] < 1.844e+18);
            uVar17 = movmskps((int)lVar14,auVar169);
            if ((~(byte)uVar17 & 7) != 0) goto LAB_00998c14;
            lVar14 = sVar24 * (uVar21 + 1);
            pfVar1 = (float *)(pcVar6 + lVar14);
            fVar106 = *pfVar1;
            fVar112 = pfVar1[1];
            fVar113 = pfVar1[2];
            auVar174._0_4_ = -(uint)(fVar106 < 1.844e+18 && fVar126 < fVar106);
            auVar174._4_4_ = -(uint)(fVar112 < 1.844e+18 && fVar133 < fVar112);
            auVar174._8_4_ = -(uint)(fVar113 < 1.844e+18 && fVar134 < fVar113);
            auVar174._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && fVar135 < pfVar1[3]);
            uVar17 = movmskps((int)lVar14,auVar174);
            if ((~(byte)uVar17 & 7) != 0) goto LAB_00998c14;
            fVar93 = fVar93 * fVar26;
            fVar94 = fVar94 * fVar26;
            lVar16 = sVar24 * (uVar21 + 2);
            pfVar1 = (float *)(pcVar6 + lVar16);
            pfVar2 = (float *)(pcVar6 + sVar24 * uVar12);
            fVar140 = *pfVar2;
            fVar141 = pfVar2[1];
            fVar155 = pfVar2[2];
            fVar178 = fVar88 * fVar26 * 0.0;
            fVar137 = fVar89 * 0.0 + fVar82 * 0.0;
            fVar145 = fVar91 * 0.0 + fVar104 * 0.0;
            fVar149 = fVar92 * 0.0 + fVar105 * 0.0;
            fVar153 = fVar94 * 0.0 + fVar178;
            fVar154 = fVar114 * 0.0;
            fVar157 = fVar120 * 0.0;
            fVar158 = fVar122 * 0.0;
            fVar159 = fVar124 * fVar26 * 0.0;
            fVar179 = fVar154 + fVar137 + fVar63;
            fVar181 = fVar157 + fVar145 + fVar81;
            fVar183 = fVar158 + fVar149 + fVar90;
            fVar185 = fVar159 + fVar153 + fVar93;
            fVar115 = (fVar114 * 3.0 + fVar137) - fVar63 * 3.0;
            fVar121 = (fVar120 * 3.0 + fVar145) - fVar81 * 3.0;
            fVar123 = (fVar122 * 3.0 + fVar149) - fVar90 * 3.0;
            fVar125 = (fVar124 * fVar26 * 3.0 + fVar153) - fVar93 * 3.0;
            fVar124 = *pfVar1 * 0.0;
            fVar137 = pfVar1[1] * 0.0;
            fVar145 = pfVar1[2] * 0.0;
            fVar114 = fVar140 * 0.0 + fVar124;
            fVar120 = fVar141 * 0.0 + fVar137;
            fVar122 = fVar155 * 0.0 + fVar145;
            fVar138 = fVar106 * 0.0;
            fVar146 = fVar112 * 0.0;
            fVar150 = fVar113 * 0.0;
            fVar139 = fVar138 + fVar114 + fVar127;
            fVar147 = fVar146 + fVar120 + fVar148;
            fVar151 = fVar150 + fVar122 + fVar152;
            fVar114 = (fVar106 * 3.0 + fVar114) - fVar127 * 3.0;
            fVar120 = (fVar112 * 3.0 + fVar120) - fVar148 * 3.0;
            fVar122 = (fVar113 * 3.0 + fVar122) - fVar152 * 3.0;
            fVar149 = fVar82 * 0.0 + fVar89 + fVar154 + fVar63 * 0.0;
            fVar153 = fVar104 * 0.0 + fVar91 + fVar157 + fVar81 * 0.0;
            fVar177 = fVar105 * 0.0 + fVar92 + fVar158 + fVar90 * 0.0;
            fVar178 = fVar178 + fVar94 + fVar159 + fVar93 * 0.0;
            fVar106 = ((fVar89 * 3.0 - fVar82 * 3.0) + fVar154) - fVar63 * 0.0;
            fVar112 = ((fVar91 * 3.0 - fVar104 * 3.0) + fVar157) - fVar81 * 0.0;
            fVar113 = ((fVar92 * 3.0 - fVar105 * 3.0) + fVar158) - fVar90 * 0.0;
            fVar94 = ((fVar94 * 3.0 - fVar88 * fVar26 * 3.0) + fVar159) - fVar93 * 0.0;
            fVar63 = fVar124 + fVar140 + fVar138 + fVar127 * 0.0;
            fVar81 = fVar137 + fVar141 + fVar146 + fVar148 * 0.0;
            fVar90 = fVar145 + fVar155 + fVar150 + fVar152 * 0.0;
            fVar93 = ((fVar140 * 3.0 - *pfVar1 * 3.0) + fVar138) - fVar127 * 0.0;
            fVar104 = ((fVar141 * 3.0 - pfVar1[1] * 3.0) + fVar146) - fVar148 * 0.0;
            fVar105 = ((fVar155 * 3.0 - pfVar1[2] * 3.0) + fVar150) - fVar152 * 0.0;
            fVar140 = fVar139 * fVar121 - fVar147 * fVar115;
            fVar148 = fVar147 * fVar123 - fVar151 * fVar121;
            fVar152 = fVar151 * fVar115 - fVar139 * fVar123;
            fVar124 = fVar121 * fVar114 - fVar120 * fVar115;
            fVar120 = fVar123 * fVar120 - fVar122 * fVar121;
            fVar122 = fVar115 * fVar122 - fVar114 * fVar123;
            fVar82 = fVar63 * fVar112 - fVar81 * fVar106;
            fVar88 = fVar81 * fVar113 - fVar90 * fVar112;
            fVar91 = fVar90 * fVar106 - fVar63 * fVar113;
            fVar63 = fVar112 * fVar93 - fVar104 * fVar106;
            fVar90 = fVar113 * fVar104 - fVar105 * fVar112;
            fVar93 = fVar106 * fVar105 - fVar93 * fVar113;
            fVar155 = fVar152 * fVar152 + fVar148 * fVar148 + fVar140 * fVar140;
            auVar59 = ZEXT416((uint)fVar155);
            auVar44 = rsqrtss(ZEXT416((uint)fVar155),auVar59);
            fVar81 = auVar44._0_4_;
            fVar141 = fVar81 * 1.5 - fVar81 * fVar81 * fVar155 * 0.5 * fVar81;
            fVar145 = fVar140 * fVar124 + fVar152 * fVar122 + fVar148 * fVar120;
            auVar44 = rcpss(auVar59,auVar59);
            fVar114 = (2.0 - fVar155 * auVar44._0_4_) * auVar44._0_4_;
            fVar127 = fVar91 * fVar91 + fVar88 * fVar88 + fVar82 * fVar82;
            auVar44 = ZEXT416((uint)fVar127);
            auVar59 = rsqrtss(ZEXT416((uint)fVar127),auVar44);
            fVar81 = auVar59._0_4_;
            fVar104 = fVar81 * 1.5 - fVar81 * fVar81 * fVar127 * 0.5 * fVar81;
            fVar137 = fVar82 * fVar63 + fVar91 * fVar93 + fVar88 * fVar90;
            auVar44 = rcpss(auVar44,auVar44);
            fVar81 = (2.0 - fVar127 * auVar44._0_4_) * auVar44._0_4_;
            fVar105 = fVar185 * fVar148 * fVar141;
            fVar89 = fVar185 * fVar152 * fVar141;
            fVar92 = fVar185 * fVar140 * fVar141;
            fVar138 = fVar179 - fVar105;
            fVar139 = fVar181 - fVar89;
            fVar146 = fVar183 - fVar92;
            fVar148 = fVar185 * fVar114 * (fVar155 * fVar120 - fVar145 * fVar148) * fVar141 +
                      fVar125 * fVar148 * fVar141;
            fVar152 = fVar185 * fVar114 * (fVar155 * fVar122 - fVar145 * fVar152) * fVar141 +
                      fVar125 * fVar152 * fVar141;
            fVar140 = fVar185 * fVar114 * (fVar155 * fVar124 - fVar145 * fVar140) * fVar141 +
                      fVar125 * fVar140 * fVar141;
            fVar114 = fVar178 * fVar88 * fVar104;
            fVar120 = fVar178 * fVar91 * fVar104;
            fVar122 = fVar178 * fVar82 * fVar104;
            fVar141 = fVar149 - fVar114;
            fVar155 = fVar153 - fVar120;
            fVar145 = fVar177 - fVar122;
            fVar124 = fVar178 * fVar81 * (fVar127 * fVar90 - fVar137 * fVar88) * fVar104 +
                      fVar94 * fVar88 * fVar104;
            fVar93 = fVar178 * fVar81 * (fVar127 * fVar93 - fVar137 * fVar91) * fVar104 +
                     fVar94 * fVar91 * fVar104;
            fVar82 = fVar178 * fVar81 * (fVar127 * fVar63 - fVar137 * fVar82) * fVar104 +
                     fVar94 * fVar82 * fVar104;
            fVar104 = (fVar115 - fVar148) * 0.33333334 + fVar138;
            fVar88 = (fVar121 - fVar152) * 0.33333334 + fVar139;
            fVar91 = (fVar123 - fVar140) * 0.33333334 + fVar146;
            fVar63 = fVar141 - (fVar106 - fVar124) * 0.33333334;
            fVar81 = fVar155 - (fVar112 - fVar93) * 0.33333334;
            fVar90 = fVar145 - (fVar113 - fVar82) * 0.33333334;
            lVar14 = 0;
            aVar30 = _DAT_01f7a9f0;
            aVar50 = _DAT_01f7a9f0;
            aVar143 = _DAT_01f7aa00;
            aVar167 = _DAT_01f7aa00;
            aVar170 = _DAT_01f7aa00;
            aVar175 = _DAT_01f7a9f0;
            bVar25 = true;
            do {
              bVar19 = bVar25;
              iVar22 = (int)lVar14;
              lVar20 = lVar14 * 4;
              fVar94 = *(float *)(bezier_basis0 + lVar20 + 0x1dc);
              fVar127 = *(float *)(bezier_basis0 + lVar20 + 0x1e0);
              fVar137 = *(float *)(bezier_basis0 + lVar20 + 0x1e4);
              fVar125 = *(float *)(bezier_basis0 + lVar20 + 0x1e8);
              lVar20 = lVar14 * 4;
              fVar147 = *(float *)(bezier_basis0 + lVar20 + 0x660);
              fVar150 = *(float *)(bezier_basis0 + lVar20 + 0x664);
              fVar151 = *(float *)(bezier_basis0 + lVar20 + 0x668);
              fVar154 = *(float *)(bezier_basis0 + lVar20 + 0x66c);
              lVar20 = lVar14 * 4;
              fVar157 = *(float *)(bezier_basis0 + lVar20 + 0xae4);
              fVar158 = *(float *)(bezier_basis0 + lVar20 + 0xae8);
              fVar159 = *(float *)(bezier_basis0 + lVar20 + 0xaec);
              fVar178 = *(float *)(bezier_basis0 + lVar20 + 0xaf0);
              lVar20 = lVar14 * 4;
              fVar185 = *(float *)(bezier_basis0 + lVar20 + 0xf68);
              fVar8 = *(float *)(bezier_basis0 + lVar20 + 0xf6c);
              fVar9 = *(float *)(bezier_basis0 + lVar20 + 0xf70);
              fVar10 = *(float *)(bezier_basis0 + lVar20 + 0xf74);
              auVar83._0_4_ =
                   fVar138 * fVar94 + fVar104 * fVar147 + fVar63 * fVar157 + fVar141 * fVar185;
              auVar83._4_4_ =
                   fVar138 * fVar127 + fVar104 * fVar150 + fVar63 * fVar158 + fVar141 * fVar8;
              auVar83._8_4_ =
                   fVar138 * fVar137 + fVar104 * fVar151 + fVar63 * fVar159 + fVar141 * fVar9;
              auVar83._12_4_ =
                   fVar138 * fVar125 + fVar104 * fVar154 + fVar63 * fVar178 + fVar141 * fVar10;
              auVar129._0_4_ =
                   fVar139 * fVar94 + fVar88 * fVar147 + fVar81 * fVar157 + fVar155 * fVar185;
              auVar129._4_4_ =
                   fVar139 * fVar127 + fVar88 * fVar150 + fVar81 * fVar158 + fVar155 * fVar8;
              auVar129._8_4_ =
                   fVar139 * fVar137 + fVar88 * fVar151 + fVar81 * fVar159 + fVar155 * fVar9;
              auVar129._12_4_ =
                   fVar139 * fVar125 + fVar88 * fVar154 + fVar81 * fVar178 + fVar155 * fVar10;
              auVar96._0_4_ =
                   fVar94 * fVar146 + fVar147 * fVar91 + fVar157 * fVar90 + fVar185 * fVar145;
              auVar96._4_4_ =
                   fVar127 * fVar146 + fVar150 * fVar91 + fVar158 * fVar90 + fVar8 * fVar145;
              auVar96._8_4_ =
                   fVar137 * fVar146 + fVar151 * fVar91 + fVar159 * fVar90 + fVar9 * fVar145;
              auVar96._12_4_ =
                   fVar125 * fVar146 + fVar154 * fVar91 + fVar178 * fVar90 + fVar10 * fVar145;
              lVar20 = lVar14 * 4;
              fVar94 = *(float *)(bezier_basis0 + lVar20 + 0x13ec);
              fVar127 = *(float *)(bezier_basis0 + lVar20 + 0x13f0);
              fVar137 = *(float *)(bezier_basis0 + lVar20 + 0x13f4);
              fVar125 = *(float *)(bezier_basis0 + lVar20 + 0x13f8);
              lVar20 = lVar14 * 4;
              fVar147 = *(float *)(bezier_basis0 + lVar20 + 0x1cf4);
              fVar150 = *(float *)(bezier_basis0 + lVar20 + 0x1cf8);
              fVar151 = *(float *)(bezier_basis0 + lVar20 + 0x1cfc);
              fVar154 = *(float *)(bezier_basis0 + lVar20 + 0x1d00);
              lVar20 = lVar14 * 4;
              fVar157 = *(float *)(bezier_basis0 + lVar20 + 0x2178);
              fVar158 = *(float *)(bezier_basis0 + lVar20 + 0x217c);
              fVar159 = *(float *)(bezier_basis0 + lVar20 + 0x2180);
              fVar178 = *(float *)(bezier_basis0 + lVar20 + 0x2184);
              lVar14 = lVar14 * 4;
              fVar185 = *(float *)(bezier_basis0 + lVar14 + 0x1870);
              fVar8 = *(float *)(bezier_basis0 + lVar14 + 0x1874);
              fVar9 = *(float *)(bezier_basis0 + lVar14 + 0x1878);
              fVar10 = *(float *)(bezier_basis0 + lVar14 + 0x187c);
              fVar64 = fVar138 * fVar94 + fVar104 * fVar185 + fVar63 * fVar147 + fVar141 * fVar157;
              fVar78 = fVar138 * fVar127 + fVar104 * fVar8 + fVar63 * fVar150 + fVar141 * fVar158;
              fVar79 = fVar138 * fVar137 + fVar104 * fVar9 + fVar63 * fVar151 + fVar141 * fVar159;
              fVar80 = fVar138 * fVar125 + fVar104 * fVar10 + fVar63 * fVar154 + fVar141 * fVar178;
              fVar168 = fVar139 * fVar94 + fVar88 * fVar185 + fVar81 * fVar147 + fVar155 * fVar157;
              fVar171 = fVar139 * fVar127 + fVar88 * fVar8 + fVar81 * fVar150 + fVar155 * fVar158;
              fVar172 = fVar139 * fVar137 + fVar88 * fVar9 + fVar81 * fVar151 + fVar155 * fVar159;
              fVar173 = fVar139 * fVar125 + fVar88 * fVar10 + fVar81 * fVar154 + fVar155 * fVar178;
              fVar94 = fVar94 * fVar146 + fVar185 * fVar91 + fVar147 * fVar90 + fVar157 * fVar145;
              fVar127 = fVar127 * fVar146 + fVar8 * fVar91 + fVar150 * fVar90 + fVar158 * fVar145;
              fVar137 = fVar137 * fVar146 + fVar9 * fVar91 + fVar151 * fVar90 + fVar159 * fVar145;
              fVar125 = fVar125 * fVar146 + fVar10 * fVar91 + fVar154 * fVar90 + fVar178 * fVar145;
              uVar180 = -(uint)(iVar22 == 0);
              uVar182 = -(uint)(iVar22 == 1);
              uVar184 = -(uint)(iVar22 == 2);
              uVar186 = -(uint)(iVar22 == 3);
              uVar61 = -(uint)(iVar22 == 7);
              uVar162 = -(uint)(iVar22 == 6);
              uVar163 = -(uint)(iVar22 == 5);
              uVar164 = -(uint)(iVar22 == 4);
              auVar117._0_4_ = (float)(~uVar61 & (uint)fVar64) * 0.055555556 + auVar83._0_4_;
              auVar117._4_4_ = (float)(~uVar162 & (uint)fVar78) * 0.055555556 + auVar83._4_4_;
              auVar117._8_4_ = (float)(~uVar163 & (uint)fVar79) * 0.055555556 + auVar83._8_4_;
              auVar117._12_4_ = (float)(~uVar164 & (uint)fVar80) * 0.055555556 + auVar83._12_4_;
              auVar59 = minps((undefined1  [16])aVar50,auVar83);
              auVar166 = maxps((undefined1  [16])aVar167,auVar83);
              auVar165._0_8_ =
                   CONCAT44(auVar83._4_4_ - (float)(~uVar182 & (uint)fVar78) * 0.055555556,
                            auVar83._0_4_ - (float)(~uVar180 & (uint)fVar64) * 0.055555556);
              auVar165._8_4_ = auVar83._8_4_ - (float)(~uVar184 & (uint)fVar79) * 0.055555556;
              auVar165._12_4_ = auVar83._12_4_ - (float)(~uVar186 & (uint)fVar80) * 0.055555556;
              auVar84._0_4_ = (float)(~uVar61 & (uint)fVar168) * 0.055555556 + auVar129._0_4_;
              auVar84._4_4_ = (float)(~uVar162 & (uint)fVar171) * 0.055555556 + auVar129._4_4_;
              auVar84._8_4_ = (float)(~uVar163 & (uint)fVar172) * 0.055555556 + auVar129._8_4_;
              auVar84._12_4_ = (float)(~uVar164 & (uint)fVar173) * 0.055555556 + auVar129._12_4_;
              auVar44 = minps((undefined1  [16])aVar30,auVar129);
              auVar169 = maxps((undefined1  [16])aVar170,auVar129);
              auVar130._0_8_ =
                   CONCAT44(auVar129._4_4_ - (float)(~uVar182 & (uint)fVar171) * 0.055555556,
                            auVar129._0_4_ - (float)(~uVar180 & (uint)fVar168) * 0.055555556);
              auVar130._8_4_ = auVar129._8_4_ - (float)(~uVar184 & (uint)fVar172) * 0.055555556;
              auVar130._12_4_ = auVar129._12_4_ - (float)(~uVar186 & (uint)fVar173) * 0.055555556;
              auVar160._0_4_ = (float)(~uVar61 & (uint)fVar94) * 0.055555556 + auVar96._0_4_;
              auVar160._4_4_ = (float)(~uVar162 & (uint)fVar127) * 0.055555556 + auVar96._4_4_;
              auVar160._8_4_ = (float)(~uVar163 & (uint)fVar137) * 0.055555556 + auVar96._8_4_;
              auVar160._12_4_ = (float)(~uVar164 & (uint)fVar125) * 0.055555556 + auVar96._12_4_;
              auVar174 = minps((undefined1  [16])aVar175,auVar96);
              auVar142 = maxps((undefined1  [16])aVar143,auVar96);
              auVar97._0_8_ =
                   CONCAT44(auVar96._4_4_ - (float)(~uVar182 & (uint)fVar127) * 0.055555556,
                            auVar96._0_4_ - (float)(~uVar180 & (uint)fVar94) * 0.055555556);
              auVar97._8_4_ = auVar96._8_4_ - (float)(~uVar184 & (uint)fVar137) * 0.055555556;
              auVar97._12_4_ = auVar96._12_4_ - (float)(~uVar186 & (uint)fVar125) * 0.055555556;
              auVar176._8_4_ = auVar165._8_4_;
              auVar176._0_8_ = auVar165._0_8_;
              auVar176._12_4_ = auVar165._12_4_;
              auVar65 = minps(auVar176,auVar117);
              aVar50 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar59,auVar65);
              auVar66._8_4_ = auVar130._8_4_;
              auVar66._0_8_ = auVar130._0_8_;
              auVar66._12_4_ = auVar130._12_4_;
              auVar59 = minps(auVar66,auVar84);
              aVar30 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar44,auVar59);
              auVar67._8_4_ = auVar97._8_4_;
              auVar67._0_8_ = auVar97._0_8_;
              auVar67._12_4_ = auVar97._12_4_;
              auVar44 = minps(auVar67,auVar160);
              aVar175 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar174,auVar44);
              auVar44 = maxps(auVar165,auVar117);
              aVar167 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar166,auVar44);
              auVar44 = maxps(auVar130,auVar84);
              aVar170 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar169,auVar44);
              auVar44 = maxps(auVar97,auVar160);
              aVar143 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar142,auVar44);
              lVar14 = 4;
              bVar25 = false;
            } while (bVar19);
            fVar179 = fVar179 + fVar105;
            fVar181 = fVar181 + fVar89;
            fVar183 = fVar183 + fVar92;
            fVar149 = fVar149 + fVar114;
            fVar153 = fVar153 + fVar120;
            fVar177 = fVar177 + fVar122;
            fVar114 = (fVar148 + fVar115) * 0.33333334 + fVar179;
            fVar120 = (fVar152 + fVar121) * 0.33333334 + fVar181;
            fVar122 = (fVar140 + fVar123) * 0.33333334 + fVar183;
            fVar63 = fVar149 - (fVar124 + fVar106) * 0.33333334;
            fVar81 = fVar153 - (fVar93 + fVar112) * 0.33333334;
            fVar90 = fVar177 - (fVar82 + fVar113) * 0.33333334;
            auVar68._4_4_ = aVar50.m128[0];
            auVar68._0_4_ = aVar50.m128[1];
            auVar68._8_4_ = aVar50.m128[3];
            auVar68._12_4_ = aVar50.m128[2];
            auVar44 = minps(auVar68,(undefined1  [16])aVar50);
            auVar51._0_8_ = auVar44._8_8_;
            auVar51._8_4_ = auVar44._0_4_;
            auVar51._12_4_ = auVar44._4_4_;
            auVar59 = minps(auVar51,auVar44);
            auVar69._4_4_ = aVar30.m128[0];
            auVar69._0_4_ = aVar30.m128[1];
            auVar69._8_4_ = aVar30.m128[3];
            auVar69._12_4_ = aVar30.m128[2];
            auVar44 = minps(auVar69,(undefined1  [16])aVar30);
            auVar98._0_8_ = auVar44._8_8_;
            auVar98._8_4_ = auVar44._0_4_;
            auVar98._12_4_ = auVar44._4_4_;
            auVar65 = minps(auVar98,auVar44);
            auVar31._4_4_ = aVar175.m128[0];
            auVar31._0_4_ = aVar175.m128[1];
            auVar31._8_4_ = aVar175.m128[3];
            auVar31._12_4_ = aVar175.m128[2];
            auVar44 = minps(auVar31,(undefined1  [16])aVar175);
            auVar32._0_8_ = auVar44._8_8_;
            auVar32._8_4_ = auVar44._0_4_;
            auVar32._12_4_ = auVar44._4_4_;
            auVar87._4_4_ = auVar65._0_4_;
            auVar87._0_4_ = auVar59._0_4_;
            auVar33._4_4_ = aVar167.m128[0];
            auVar33._0_4_ = aVar167.m128[1];
            auVar33._8_4_ = aVar167.m128[3];
            auVar33._12_4_ = aVar167.m128[2];
            auVar59 = maxps(auVar33,(undefined1  [16])aVar167);
            auVar52._0_8_ = auVar59._8_8_;
            auVar52._8_4_ = auVar59._0_4_;
            auVar52._12_4_ = auVar59._4_4_;
            auVar65 = maxps(auVar52,auVar59);
            auVar34._4_4_ = aVar170.m128[0];
            auVar34._0_4_ = aVar170.m128[1];
            auVar34._8_4_ = aVar170.m128[3];
            auVar34._12_4_ = aVar170.m128[2];
            auVar59 = maxps(auVar34,(undefined1  [16])aVar170);
            auVar70._0_8_ = auVar59._8_8_;
            auVar70._8_4_ = auVar59._0_4_;
            auVar70._12_4_ = auVar59._4_4_;
            auVar59 = maxps(auVar70,auVar59);
            auVar35._4_4_ = aVar143.m128[0];
            auVar35._0_4_ = aVar143.m128[1];
            auVar35._8_4_ = aVar143.m128[3];
            auVar35._12_4_ = aVar143.m128[2];
            local_a8 = maxps(auVar35,(undefined1  [16])aVar143);
            local_b8._0_8_ = local_a8._8_8_;
            local_b8._8_4_ = local_a8._0_4_;
            local_b8._12_4_ = local_a8._4_4_;
            auVar101._4_4_ = auVar59._0_4_;
            auVar101._0_4_ = auVar65._0_4_;
            lVar14 = 0;
            local_338 = _DAT_01f7a9f0;
            local_348 = _DAT_01f7aa00;
            aVar30 = _DAT_01f7aa00;
            aVar50 = _DAT_01f7a9f0;
            aVar143 = _DAT_01f7a9f0;
            aVar167 = _DAT_01f7aa00;
            bVar25 = true;
            do {
              bVar19 = bVar25;
              iVar22 = (int)lVar14;
              lVar20 = lVar14 * 4;
              fVar93 = *(float *)(bezier_basis0 + lVar20 + 0x1dc);
              fVar124 = *(float *)(bezier_basis0 + lVar20 + 0x1e0);
              fVar82 = *(float *)(bezier_basis0 + lVar20 + 0x1e4);
              fVar104 = *(float *)(bezier_basis0 + lVar20 + 0x1e8);
              lVar20 = lVar14 * 4;
              fVar105 = *(float *)(bezier_basis0 + lVar20 + 0x660);
              fVar88 = *(float *)(bezier_basis0 + lVar20 + 0x664);
              fVar89 = *(float *)(bezier_basis0 + lVar20 + 0x668);
              fVar91 = *(float *)(bezier_basis0 + lVar20 + 0x66c);
              lVar20 = lVar14 * 4;
              fVar92 = *(float *)(bezier_basis0 + lVar20 + 0xae4);
              fVar94 = *(float *)(bezier_basis0 + lVar20 + 0xae8);
              fVar127 = *(float *)(bezier_basis0 + lVar20 + 0xaec);
              fVar148 = *(float *)(bezier_basis0 + lVar20 + 0xaf0);
              lVar20 = lVar14 * 4;
              fVar152 = *(float *)(bezier_basis0 + lVar20 + 0xf68);
              fVar106 = *(float *)(bezier_basis0 + lVar20 + 0xf6c);
              fVar112 = *(float *)(bezier_basis0 + lVar20 + 0xf70);
              fVar113 = *(float *)(bezier_basis0 + lVar20 + 0xf74);
              auVar85._0_4_ =
                   fVar179 * fVar93 + fVar114 * fVar105 + fVar63 * fVar92 + fVar149 * fVar152;
              auVar85._4_4_ =
                   fVar179 * fVar124 + fVar114 * fVar88 + fVar63 * fVar94 + fVar149 * fVar106;
              auVar85._8_4_ =
                   fVar179 * fVar82 + fVar114 * fVar89 + fVar63 * fVar127 + fVar149 * fVar112;
              auVar85._12_4_ =
                   fVar179 * fVar104 + fVar114 * fVar91 + fVar63 * fVar148 + fVar149 * fVar113;
              auVar71._0_4_ =
                   fVar181 * fVar93 + fVar120 * fVar105 + fVar81 * fVar92 + fVar153 * fVar152;
              auVar71._4_4_ =
                   fVar181 * fVar124 + fVar120 * fVar88 + fVar81 * fVar94 + fVar153 * fVar106;
              auVar71._8_4_ =
                   fVar181 * fVar82 + fVar120 * fVar89 + fVar81 * fVar127 + fVar153 * fVar112;
              auVar71._12_4_ =
                   fVar181 * fVar104 + fVar120 * fVar91 + fVar81 * fVar148 + fVar153 * fVar113;
              auVar99._0_4_ =
                   fVar93 * fVar183 + fVar105 * fVar122 + fVar92 * fVar90 + fVar152 * fVar177;
              auVar99._4_4_ =
                   fVar124 * fVar183 + fVar88 * fVar122 + fVar94 * fVar90 + fVar106 * fVar177;
              auVar99._8_4_ =
                   fVar82 * fVar183 + fVar89 * fVar122 + fVar127 * fVar90 + fVar112 * fVar177;
              auVar99._12_4_ =
                   fVar104 * fVar183 + fVar91 * fVar122 + fVar148 * fVar90 + fVar113 * fVar177;
              lVar20 = lVar14 * 4;
              fVar93 = *(float *)(bezier_basis0 + lVar20 + 0x13ec);
              fVar124 = *(float *)(bezier_basis0 + lVar20 + 0x13f0);
              fVar82 = *(float *)(bezier_basis0 + lVar20 + 0x13f4);
              fVar104 = *(float *)(bezier_basis0 + lVar20 + 0x13f8);
              lVar20 = lVar14 * 4;
              fVar105 = *(float *)(bezier_basis0 + lVar20 + 0x1cf4);
              fVar88 = *(float *)(bezier_basis0 + lVar20 + 0x1cf8);
              fVar89 = *(float *)(bezier_basis0 + lVar20 + 0x1cfc);
              fVar91 = *(float *)(bezier_basis0 + lVar20 + 0x1d00);
              lVar20 = lVar14 * 4;
              fVar92 = *(float *)(bezier_basis0 + lVar20 + 0x2178);
              fVar94 = *(float *)(bezier_basis0 + lVar20 + 0x217c);
              fVar127 = *(float *)(bezier_basis0 + lVar20 + 0x2180);
              fVar148 = *(float *)(bezier_basis0 + lVar20 + 0x2184);
              lVar14 = lVar14 * 4;
              fVar152 = *(float *)(bezier_basis0 + lVar14 + 0x1870);
              fVar106 = *(float *)(bezier_basis0 + lVar14 + 0x1874);
              fVar112 = *(float *)(bezier_basis0 + lVar14 + 0x1878);
              fVar113 = *(float *)(bezier_basis0 + lVar14 + 0x187c);
              fVar145 = fVar179 * fVar93 + fVar114 * fVar152 + fVar63 * fVar105 + fVar149 * fVar92;
              fVar115 = fVar179 * fVar124 + fVar114 * fVar106 + fVar63 * fVar88 + fVar149 * fVar94;
              fVar121 = fVar179 * fVar82 + fVar114 * fVar112 + fVar63 * fVar89 + fVar149 * fVar127;
              fVar123 = fVar179 * fVar104 + fVar114 * fVar113 + fVar63 * fVar91 + fVar149 * fVar148;
              fVar140 = fVar181 * fVar93 + fVar120 * fVar152 + fVar81 * fVar105 + fVar153 * fVar92;
              fVar141 = fVar181 * fVar124 + fVar120 * fVar106 + fVar81 * fVar88 + fVar153 * fVar94;
              fVar155 = fVar181 * fVar82 + fVar120 * fVar112 + fVar81 * fVar89 + fVar153 * fVar127;
              fVar137 = fVar181 * fVar104 + fVar120 * fVar113 + fVar81 * fVar91 + fVar153 * fVar148;
              fVar93 = fVar93 * fVar183 + fVar152 * fVar122 + fVar105 * fVar90 + fVar92 * fVar177;
              fVar124 = fVar124 * fVar183 + fVar106 * fVar122 + fVar88 * fVar90 + fVar94 * fVar177;
              fVar82 = fVar82 * fVar183 + fVar112 * fVar122 + fVar89 * fVar90 + fVar127 * fVar177;
              fVar104 = fVar104 * fVar183 + fVar113 * fVar122 + fVar91 * fVar90 + fVar148 * fVar177;
              uVar61 = -(uint)(iVar22 == 0);
              uVar162 = -(uint)(iVar22 == 1);
              uVar163 = -(uint)(iVar22 == 2);
              uVar164 = -(uint)(iVar22 == 3);
              uVar180 = -(uint)(iVar22 == 7);
              uVar182 = -(uint)(iVar22 == 6);
              uVar184 = -(uint)(iVar22 == 5);
              uVar186 = -(uint)(iVar22 == 4);
              auVar36._0_4_ = (float)(~uVar180 & (uint)fVar145) * 0.055555556 + auVar85._0_4_;
              auVar36._4_4_ = (float)(~uVar182 & (uint)fVar115) * 0.055555556 + auVar85._4_4_;
              auVar36._8_4_ = (float)(~uVar184 & (uint)fVar121) * 0.055555556 + auVar85._8_4_;
              auVar36._12_4_ = (float)(~uVar186 & (uint)fVar123) * 0.055555556 + auVar85._12_4_;
              auVar174 = minps((undefined1  [16])aVar143,auVar85);
              auVar142 = maxps((undefined1  [16])local_348,auVar85);
              auVar86._0_8_ =
                   CONCAT44(auVar85._4_4_ - (float)(~uVar162 & (uint)fVar115) * 0.055555556,
                            auVar85._0_4_ - (float)(~uVar61 & (uint)fVar145) * 0.055555556);
              auVar86._8_4_ = auVar85._8_4_ - (float)(~uVar163 & (uint)fVar121) * 0.055555556;
              auVar86._12_4_ = auVar85._12_4_ - (float)(~uVar164 & (uint)fVar123) * 0.055555556;
              auVar53._0_4_ = (float)(~uVar180 & (uint)fVar140) * 0.055555556 + auVar71._0_4_;
              auVar53._4_4_ = (float)(~uVar182 & (uint)fVar141) * 0.055555556 + auVar71._4_4_;
              auVar53._8_4_ = (float)(~uVar184 & (uint)fVar155) * 0.055555556 + auVar71._8_4_;
              auVar53._12_4_ = (float)(~uVar186 & (uint)fVar137) * 0.055555556 + auVar71._12_4_;
              auVar166 = minps((undefined1  [16])local_338,auVar71);
              auVar176 = maxps((undefined1  [16])aVar167,auVar71);
              auVar72._0_8_ =
                   CONCAT44(auVar71._4_4_ - (float)(~uVar162 & (uint)fVar141) * 0.055555556,
                            auVar71._0_4_ - (float)(~uVar61 & (uint)fVar140) * 0.055555556);
              auVar72._8_4_ = auVar71._8_4_ - (float)(~uVar163 & (uint)fVar155) * 0.055555556;
              auVar72._12_4_ = auVar71._12_4_ - (float)(~uVar164 & (uint)fVar137) * 0.055555556;
              auVar144._0_4_ = (float)(~uVar180 & (uint)fVar93) * 0.055555556 + auVar99._0_4_;
              auVar144._4_4_ = (float)(~uVar182 & (uint)fVar124) * 0.055555556 + auVar99._4_4_;
              auVar144._8_4_ = (float)(~uVar184 & (uint)fVar82) * 0.055555556 + auVar99._8_4_;
              auVar144._12_4_ = (float)(~uVar186 & (uint)fVar104) * 0.055555556 + auVar99._12_4_;
              auVar169 = minps((undefined1  [16])aVar50,auVar99);
              auVar65 = maxps((undefined1  [16])aVar30,auVar99);
              auVar100._0_8_ =
                   CONCAT44(auVar99._4_4_ - (float)(~uVar162 & (uint)fVar124) * 0.055555556,
                            auVar99._0_4_ - (float)(~uVar61 & (uint)fVar93) * 0.055555556);
              auVar100._8_4_ = auVar99._8_4_ - (float)(~uVar163 & (uint)fVar82) * 0.055555556;
              auVar100._12_4_ = auVar99._12_4_ - (float)(~uVar164 & (uint)fVar104) * 0.055555556;
              auVar107._8_4_ = auVar86._8_4_;
              auVar107._0_8_ = auVar86._0_8_;
              auVar107._12_4_ = auVar86._12_4_;
              auVar59 = minps(auVar107,auVar36);
              aVar143 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar174,auVar59);
              auVar108._8_4_ = auVar72._8_4_;
              auVar108._0_8_ = auVar72._0_8_;
              auVar108._12_4_ = auVar72._12_4_;
              auVar59 = minps(auVar108,auVar53);
              local_338 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar166,auVar59);
              auVar109._8_4_ = auVar100._8_4_;
              auVar109._0_8_ = auVar100._0_8_;
              auVar109._12_4_ = auVar100._12_4_;
              auVar59 = minps(auVar109,auVar144);
              aVar50 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar169,auVar59);
              auVar59 = maxps(auVar86,auVar36);
              local_348 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar142,auVar59);
              auVar59 = maxps(auVar72,auVar53);
              aVar167 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar176,auVar59);
              auVar59 = maxps(auVar100,auVar144);
              aVar30 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar65,auVar59);
              lVar14 = 4;
              bVar25 = false;
            } while (bVar19);
            auVar44 = minps(auVar32,auVar44);
            auVar87._8_4_ = auVar44._0_4_;
            auVar87._12_4_ = 0;
            auVar44 = maxps(local_b8,local_a8);
            auVar101._8_4_ = auVar44._0_4_;
            auVar101._12_4_ = 0;
            auVar37._4_4_ = aVar143.m128[0];
            auVar37._0_4_ = aVar143.m128[1];
            auVar37._8_4_ = aVar143.m128[3];
            auVar37._12_4_ = aVar143.m128[2];
            auVar44 = minps(auVar37,(undefined1  [16])aVar143);
            auVar54._0_8_ = auVar44._8_8_;
            auVar54._8_4_ = auVar44._0_4_;
            auVar54._12_4_ = auVar44._4_4_;
            auVar59 = minps(auVar54,auVar44);
            auVar38._4_4_ = local_338.m128[0];
            auVar38._0_4_ = local_338.m128[1];
            auVar38._8_4_ = local_338.m128[3];
            auVar38._12_4_ = local_338.m128[2];
            auVar44 = minps(auVar38,(undefined1  [16])local_338);
            auVar73._0_8_ = auVar44._8_8_;
            auVar73._8_4_ = auVar44._0_4_;
            auVar73._12_4_ = auVar44._4_4_;
            auVar65 = minps(auVar73,auVar44);
            auVar39._4_4_ = aVar50.m128[0];
            auVar39._0_4_ = aVar50.m128[1];
            auVar39._8_4_ = aVar50.m128[3];
            auVar39._12_4_ = aVar50.m128[2];
            auVar44 = minps(auVar39,(undefined1  [16])aVar50);
            auVar55._0_8_ = auVar44._8_8_;
            auVar55._8_4_ = auVar44._0_4_;
            auVar55._12_4_ = auVar44._4_4_;
            auVar44 = minps(auVar55,auVar44);
            auVar74._4_4_ = auVar65._0_4_;
            auVar74._0_4_ = auVar59._0_4_;
            auVar74._8_4_ = auVar44._0_4_;
            auVar74._12_4_ = 0;
            auVar142 = minps(auVar87,auVar74);
            auVar40._4_4_ = local_348.m128[0];
            auVar40._0_4_ = local_348.m128[1];
            auVar40._8_4_ = local_348.m128[3];
            auVar40._12_4_ = local_348.m128[2];
            auVar44 = maxps(auVar40,(undefined1  [16])local_348);
            auVar56._0_8_ = auVar44._8_8_;
            auVar56._8_4_ = auVar44._0_4_;
            auVar56._12_4_ = auVar44._4_4_;
            auVar59 = maxps(auVar56,auVar44);
            auVar41._4_4_ = aVar167.m128[0];
            auVar41._0_4_ = aVar167.m128[1];
            auVar41._8_4_ = aVar167.m128[3];
            auVar41._12_4_ = aVar167.m128[2];
            auVar44 = maxps(auVar41,(undefined1  [16])aVar167);
            auVar75._0_8_ = auVar44._8_8_;
            auVar75._8_4_ = auVar44._0_4_;
            auVar75._12_4_ = auVar44._4_4_;
            auVar65 = maxps(auVar75,auVar44);
            auVar42._4_4_ = aVar30.m128[0];
            auVar42._0_4_ = aVar30.m128[1];
            auVar42._8_4_ = aVar30.m128[3];
            auVar42._12_4_ = aVar30.m128[2];
            auVar44 = maxps(auVar42,(undefined1  [16])aVar30);
            auVar57._0_8_ = auVar44._8_8_;
            auVar57._8_4_ = auVar44._0_4_;
            auVar57._12_4_ = auVar44._4_4_;
            auVar44 = maxps(auVar57,auVar44);
            auVar76._4_4_ = auVar65._0_4_;
            auVar76._0_4_ = auVar59._0_4_;
            auVar76._8_4_ = auVar44._0_4_;
            auVar76._12_4_ = 0;
            auVar44 = maxps(auVar101,auVar76);
            auVar102._0_4_ = -(uint)(auVar44._0_4_ < 1.844e+18 && fVar126 < auVar142._0_4_);
            auVar102._4_4_ = -(uint)(auVar44._4_4_ < 1.844e+18 && fVar133 < auVar142._4_4_);
            auVar102._8_4_ = -(uint)(auVar44._8_4_ < 1.844e+18 && fVar134 < auVar142._8_4_);
            auVar102._12_4_ = -(uint)(auVar44._12_4_ < 1.844e+18 && fVar135 < auVar142._12_4_);
            uVar17 = movmskps((int)lVar16,auVar102);
            if ((~(byte)uVar17 & 7) != 0) goto LAB_00998c14;
            uVar15 = uVar15 + 1;
          } while (uVar15 <= (ulong)(long)(int)fVar47);
          local_328 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry
                      .super_Geometry.time_range;
        }
        local_108.primID = &local_110;
        fVar63 = (fVar28 - local_328.lower) / (local_328.upper - local_328.lower);
        fVar81 = (fVar27 - local_328.lower) / (local_328.upper - local_328.lower);
        fVar27 = fVar11 * fVar63;
        fVar26 = fVar11 * fVar81;
        local_110 = uVar13;
        local_108.this = this;
        fVar28 = floorf(fVar27);
        fVar47 = ceilf(fVar26);
        uVar21 = (uint)fVar28;
        if (fVar28 <= 0.0) {
          fVar28 = 0.0;
        }
        fVar90 = fVar47;
        if (fVar11 <= fVar47) {
          fVar90 = fVar11;
        }
        if ((int)uVar21 < 0) {
          uVar21 = 0xffffffff;
        }
        iVar22 = (int)fVar11 + 1;
        if ((int)fVar47 < (int)fVar11 + 1) {
          iVar22 = (int)fVar47;
        }
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_d8.field_1,&local_108,(long)(int)fVar28);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_f8.field_1,&local_108,(long)(int)fVar90);
        if (iVar22 - uVar21 == 1) {
          fVar11 = fVar27 - fVar28;
          if (fVar27 - fVar28 <= 0.0) {
            fVar11 = 0.0;
          }
          fVar28 = 1.0 - fVar11;
          auVar128._0_4_ = fVar28 * local_d8.m128[0] + fVar11 * local_f8.m128[0];
          auVar128._4_4_ = fVar28 * local_d8.m128[1] + fVar11 * local_f8.m128[1];
          auVar128._8_4_ = fVar28 * local_d8.m128[2] + fVar11 * local_f8.m128[2];
          auVar116._0_4_ = fVar28 * local_c8 + fVar11 * local_e8;
          auVar116._4_4_ = fVar28 * fStack_c4 + fVar11 * fStack_e4;
          auVar116._8_4_ = fVar28 * fStack_c0 + fVar11 * fStack_e0;
          fVar11 = fVar90 - fVar26;
          if (fVar90 - fVar26 <= 0.0) {
            fVar11 = 0.0;
          }
          fVar28 = 1.0 - fVar11;
          auVar29._0_4_ = local_f8.m128[0] * fVar28 + local_d8.m128[0] * fVar11;
          auVar29._4_4_ = local_f8.m128[1] * fVar28 + local_d8.m128[1] * fVar11;
          auVar29._8_4_ = local_f8.m128[2] * fVar28 + local_d8.m128[2] * fVar11;
          auVar49._0_4_ = fVar28 * local_e8 + fVar11 * local_c8;
          auVar49._4_4_ = fVar28 * fStack_e4 + fVar11 * fStack_c4;
          auVar49._8_4_ = fVar28 * fStack_e0 + fVar11 * fStack_c0;
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_108,(long)((int)fVar28 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_108,(long)((int)fVar90 + -1));
          fVar47 = fVar27 - fVar28;
          if (fVar27 - fVar28 <= 0.0) {
            fVar47 = 0.0;
          }
          fVar28 = 1.0 - fVar47;
          auVar128._0_4_ = local_d8.m128[0] * fVar28 + local_58.m128[0] * fVar47;
          auVar128._4_4_ = local_d8.m128[1] * fVar28 + local_58.m128[1] * fVar47;
          auVar128._8_4_ = local_d8.m128[2] * fVar28 + local_58.m128[2] * fVar47;
          auVar131._12_4_ = local_d8.m128[3] * fVar28 + local_58.m128[3] * fVar47;
          auVar131._0_12_ = auVar128;
          auVar116._0_4_ = fVar28 * local_c8 + fVar47 * local_48;
          auVar116._4_4_ = fVar28 * fStack_c4 + fVar47 * fStack_44;
          auVar116._8_4_ = fVar28 * fStack_c0 + fVar47 * fStack_40;
          auVar118._12_4_ = fVar28 * fStack_bc + fVar47 * fStack_3c;
          auVar118._0_12_ = auVar116;
          fVar28 = fVar90 - fVar26;
          if (fVar90 - fVar26 <= 0.0) {
            fVar28 = 0.0;
          }
          fVar27 = 1.0 - fVar28;
          auVar110._0_8_ =
               CONCAT44(local_f8.m128[1] * fVar27 + local_78.m128[1] * fVar28,
                        local_f8.m128[0] * fVar27 + local_78.m128[0] * fVar28);
          auVar110._8_4_ = local_f8.m128[2] * fVar27 + local_78.m128[2] * fVar28;
          auVar110._12_4_ = local_f8.m128[3] * fVar27 + local_78.m128[3] * fVar28;
          auVar103._0_8_ =
               CONCAT44(fVar27 * fStack_e4 + fVar28 * fStack_64,
                        fVar27 * local_e8 + fVar28 * local_68);
          auVar103._8_4_ = fVar27 * fStack_e0 + fVar28 * fStack_60;
          auVar103._12_4_ = fVar27 * fStack_dc + fVar28 * fStack_5c;
          if ((int)(uVar21 + 1) < iVar22) {
            sVar24 = (size_t)(uVar21 + 1);
            iVar22 = ~uVar21 + iVar22;
            do {
              fVar28 = ((float)(int)sVar24 / fVar11 - fVar63) / (fVar81 - fVar63);
              fVar47 = 1.0 - fVar28;
              fVar27 = auVar110._12_4_;
              fVar26 = auVar103._12_4_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_108,sVar24);
              auVar43._0_4_ = local_98.m128[0] - (auVar131._0_4_ * fVar47 + auVar110._0_4_ * fVar28)
              ;
              auVar43._4_4_ = local_98.m128[1] - (auVar131._4_4_ * fVar47 + auVar110._4_4_ * fVar28)
              ;
              auVar43._8_4_ = local_98.m128[2] - (auVar131._8_4_ * fVar47 + auVar110._8_4_ * fVar28)
              ;
              auVar43._12_4_ = local_98.m128[3] - (auVar131._12_4_ * fVar47 + fVar27 * fVar28);
              auVar58._0_4_ = local_88 - (fVar47 * auVar118._0_4_ + fVar28 * auVar103._0_4_);
              auVar58._4_4_ = fStack_84 - (fVar47 * auVar118._4_4_ + fVar28 * auVar103._4_4_);
              auVar58._8_4_ = fStack_80 - (fVar47 * auVar118._8_4_ + fVar28 * auVar103._8_4_);
              auVar58._12_4_ = fStack_7c - (fVar47 * auVar118._12_4_ + fVar28 * fVar26);
              auVar44 = minps(auVar43,ZEXT816(0));
              auVar59 = maxps(auVar58,ZEXT816(0));
              auVar128._0_4_ = auVar131._0_4_ + auVar44._0_4_;
              auVar128._4_4_ = auVar131._4_4_ + auVar44._4_4_;
              auVar128._8_4_ = auVar131._8_4_ + auVar44._8_4_;
              auVar131._12_4_ = auVar131._12_4_ + auVar44._12_4_;
              auVar131._0_12_ = auVar128;
              auVar29._0_8_ =
                   CONCAT44(auVar44._4_4_ + auVar110._4_4_,auVar44._0_4_ + auVar110._0_4_);
              auVar29._8_4_ = auVar44._8_4_ + auVar110._8_4_;
              auVar116._0_4_ = auVar118._0_4_ + auVar59._0_4_;
              auVar116._4_4_ = auVar118._4_4_ + auVar59._4_4_;
              auVar116._8_4_ = auVar118._8_4_ + auVar59._8_4_;
              auVar118._12_4_ = auVar118._12_4_ + auVar59._12_4_;
              auVar118._0_12_ = auVar116;
              auVar49._0_8_ =
                   CONCAT44(auVar59._4_4_ + auVar103._4_4_,auVar59._0_4_ + auVar103._0_4_);
              auVar49._8_4_ = auVar59._8_4_ + auVar103._8_4_;
              sVar24 = sVar24 + 1;
              auVar103._8_4_ = auVar49._8_4_;
              auVar103._0_8_ = auVar49._0_8_;
              auVar103._12_4_ = auVar59._12_4_ + fVar26;
              auVar110._8_4_ = auVar29._8_4_;
              auVar110._0_8_ = auVar29._0_8_;
              auVar110._12_4_ = auVar44._12_4_ + fVar27;
              iVar22 = iVar22 + -1;
            } while (iVar22 != 0);
          }
          else {
            auVar29._8_4_ = auVar110._8_4_;
            auVar29._0_8_ = auVar110._0_8_;
            auVar49._8_4_ = auVar103._8_4_;
            auVar49._0_8_ = auVar103._0_8_;
          }
        }
        fVar11 = (float)((this->super_CurveGeometryInterface<embree::BezierCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        uVar12 = (ulong)(uint)fVar11;
        aVar132.m128[3] = (float)geomID;
        aVar132._0_12_ = auVar128;
        aVar119.m128[3] = (float)uVar13;
        aVar119._0_12_ = auVar116;
        aVar45.m128[3] = fVar11;
        aVar45._0_12_ = auVar29;
        aVar60.m128[3] = fVar11;
        aVar60._0_12_ = auVar49;
        auVar77._0_4_ =
             auVar116._0_4_ * 0.5 + auVar49._0_4_ * 0.5 + auVar128._0_4_ * 0.5 + auVar29._0_4_ * 0.5
        ;
        auVar77._4_4_ =
             auVar116._4_4_ * 0.5 + auVar49._4_4_ * 0.5 + auVar128._4_4_ * 0.5 + auVar29._4_4_ * 0.5
        ;
        auVar77._8_4_ =
             auVar116._8_4_ * 0.5 + auVar49._8_4_ * 0.5 + auVar128._8_4_ * 0.5 + auVar29._8_4_ * 0.5
        ;
        auVar77._12_4_ = (float)uVar13 * 0.5 + fVar11 * 0.5 + (float)geomID * 0.5 + fVar11 * 0.5;
        BVar3 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        aVar111.m128 = (__m128)minps(aVar111.m128,aVar132.m128);
        local_250 = local_250 + 1;
        local_248 = local_248 + uVar12;
        bVar25 = local_298 < uVar12;
        if (local_298 <= uVar12) {
          local_298 = uVar12;
        }
        pPVar7 = prims->items;
        pPVar7[local_240].lbounds.bounds0.lower.field_0 = aVar132;
        aVar161.m128 = (__m128)maxps(aVar161.m128,aVar119.m128);
        pPVar7[local_240].lbounds.bounds0.upper.field_0 = aVar119;
        aVar156.m128 = (__m128)minps(aVar156.m128,aVar45.m128);
        pPVar7[local_240].lbounds.bounds1.lower.field_0 = aVar45;
        local_238.m128 = (__m128)maxps(local_238.m128,aVar60.m128);
        pPVar7[local_240].lbounds.bounds1.upper.field_0 = aVar60;
        pPVar7[local_240].time_range = BVar3;
        local_228.m128 = (__m128)minps(local_228.m128,auVar77);
        aVar46.m128 = (__m128)maxps(aVar46.m128,auVar77);
        fVar11 = BVar3.lower;
        if (fVar11 <= fVar136) {
          fVar136 = fVar11;
        }
        fVar27 = BVar3.upper;
        fVar28 = fVar27;
        if (fVar27 <= fVar95) {
          fVar28 = fVar95;
        }
        uVar21 = (int)((uint)bVar25 << 0x1f) >> 0x1f;
        uVar61 = (int)((uint)bVar25 << 0x1f) >> 0x1f;
        fVar48 = (float)(~uVar21 & (uint)fVar48 | (uint)fVar11 & uVar21);
        fVar62 = (float)(~uVar61 & (uint)fVar62 | (uint)fVar27 & uVar61);
        local_240 = local_240 + 1;
        fVar95 = fVar28;
      }
LAB_00998c14:
      uVar13 = uVar13 + 1;
    } while (uVar13 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_250;
  }
  else {
    fVar48 = 0.0;
    fVar62 = 1.0;
    fVar136 = 1.0;
    fVar95 = 0.0;
    local_298 = 0;
    local_248 = 0;
    local_228 = _DAT_01f7a9f0;
    local_238 = _DAT_01f7aa00;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar111;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar161;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar156;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = local_238;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_228;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar46;
  (__return_storage_ptr__->time_range).lower = fVar136;
  (__return_storage_ptr__->time_range).upper = fVar95;
  __return_storage_ptr__->num_time_segments = local_248;
  __return_storage_ptr__->max_num_time_segments = local_298;
  (__return_storage_ptr__->max_time_range).lower = fVar48;
  (__return_storage_ptr__->max_time_range).upper = fVar62;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }